

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<int> *
testing::internal::ActionResultHolder<int>::PerformAction<int(int,int,int,int,int,int,int,int)>
          (Action<int_(int,_int,_int,_int,_int,_int,_int,_int)> *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<int> *pAVar2;
  ArgumentTuple local_38;
  
  pAVar2 = (ActionResultHolder<int> *)operator_new(0x10);
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int>.super__Tuple_impl<7UL,_int>
  .super__Head_base<7UL,_int,_false>._M_head_impl =
       *(_Head_base<7UL,_int,_false> *)
        &(args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
         super__Tuple_impl<5UL,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int>;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int>.
  super__Head_base<6UL,_int,_false>._M_head_impl =
       ((_Head_base<6UL,_int,_false> *)
       ((long)&(args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
               super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
               super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
               super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.
               super__Tuple_impl<4UL,_int,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int,_int>.
               super__Tuple_impl<6UL,_int,_int> + 4))->_M_head_impl;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int>.super__Head_base<5UL,_int,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
       super__Tuple_impl<5UL,_int,_int,_int>.super__Head_base<5UL,_int,_false>._M_head_impl;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
  super__Head_base<4UL,_int,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Tuple_impl<4UL,_int,_int,_int,_int>.
       super__Head_base<4UL,_int,_false>._M_head_impl;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<3UL,_int,_int,_int,_int,_int>.super__Head_base<3UL,_int,_false>.
       _M_head_impl;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.super__Head_base<2UL,_int,_false>.
  _M_head_impl = (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int>.
                 super__Head_base<2UL,_int,_false>._M_head_impl;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
  _M_head_impl = (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int>.
                 super__Head_base<1UL,_int,_false>._M_head_impl;
  local_38.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Head_base<0UL,_int,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int>).
       super__Head_base<0UL,_int,_false>._M_head_impl;
  RVar1 = Action<int_(int,_int,_int,_int,_int,_int,_int,_int)>::Perform(action,&local_38);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00191310;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }